

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

bool flatbuffers::IsVectorOfStruct(Type *type)

{
  bool bVar1;
  bool local_31;
  Type local_30;
  Type *local_10;
  Type *type_local;
  
  local_10 = type;
  bVar1 = IsVector(type);
  local_31 = false;
  if (bVar1) {
    Type::VectorType(&local_30,local_10);
    local_31 = IsStruct(&local_30);
  }
  return local_31;
}

Assistant:

inline bool IsVectorOfStruct(const Type &type) {
  return IsVector(type) && IsStruct(type.VectorType());
}